

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.cpp
# Opt level: O2

value * mjs::anon_unknown_46::json_parse_value(value *__return_storage_ptr__,json_lexer *lex)

{
  json_token *this;
  value *pvVar1;
  gc_heap *pgVar2;
  json_token_type jVar3;
  wstring *pwVar4;
  long *plVar5;
  uint32_t index;
  uint uVar6;
  int iVar7;
  gc_heap_ptr_untyped *this_00;
  bool bVar8;
  double dVar9;
  object_ptr o;
  wstring key;
  json_token token;
  object_ptr a;
  undefined1 local_1a0 [16];
  undefined1 local_190 [8];
  pointer local_188;
  undefined1 local_160 [32];
  wstring_view local_140;
  undefined1 local_130 [48];
  undefined1 local_100 [48];
  undefined1 local_d0 [8];
  _Alloc_hider local_c8;
  gc_heap_ptr_untyped local_a0;
  undefined1 local_90 [8];
  _Alloc_hider local_88;
  undefined1 local_60 [48];
  
  json_lexer::skip_whitespace(lex);
  this = &lex->tok_;
  json_token::json_token((json_token *)local_130,this);
  json_lexer::next_token((json_token *)local_60,lex);
  std::__cxx11::wstring::~wstring((wstring *)(local_60 + 8));
  switch(local_130._0_4_) {
  case 1:
    pgVar2 = (lex->global_).super_gc_heap_ptr_untyped.heap_;
    pwVar4 = (anonymous_namespace)::json_token::text_abi_cxx11_((json_token *)local_130);
    local_88._M_p = (pwVar4->_M_dataplus)._M_p;
    local_90 = (undefined1  [8])pwVar4->_M_string_length;
    string::string((string *)(local_1a0 + 0x10),pgVar2,(wstring_view *)local_90);
    value::value(__return_storage_ptr__,(string *)(local_1a0 + 0x10));
    this_00 = (gc_heap_ptr_untyped *)(local_1a0 + 0x10);
    goto LAB_0014423d;
  case 2:
    pwVar4 = (anonymous_namespace)::json_token::text_abi_cxx11_((json_token *)local_130);
    local_188 = (pwVar4->_M_dataplus)._M_p;
    local_190 = (undefined1  [8])pwVar4->_M_string_length;
    dVar9 = to_number((wstring_view *)(local_1a0 + 0x10));
    __return_storage_ptr__->type_ = number;
    (__return_storage_ptr__->field_1).n_ = dVar9;
    break;
  case 3:
    value::value(__return_storage_ptr__,(value *)value::null);
    break;
  case 4:
    __return_storage_ptr__->type_ = boolean;
    (__return_storage_ptr__->field_1).b_ = false;
    break;
  case 5:
    __return_storage_ptr__->type_ = boolean;
    (__return_storage_ptr__->field_1).b_ = true;
    break;
  case 6:
    uVar6 = 0;
    make_array((gc_heap_ptr<mjs::global_object> *)local_100,(uint32_t)lex);
    pgVar2 = (lex->global_).super_gc_heap_ptr_untyped.heap_;
    pvVar1 = (value *)(local_1a0 + 0x10);
    while( true ) {
      json_lexer::skip_whitespace(lex);
      if (this->type_ == rbracket) break;
      if (uVar6 != 0) {
        if (this->type_ != comma) {
          json_lexer::throw_unexpected(lex);
        }
        json_lexer::next_token((json_token *)local_90,lex);
        std::__cxx11::wstring::~wstring((wstring *)&local_88);
        json_lexer::skip_whitespace(lex);
      }
      plVar5 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_100);
      index_string_abi_cxx11_((wstring *)local_d0,(mjs *)(ulong)uVar6,index);
      local_1a0._0_8_ = local_c8._M_p;
      local_1a0._8_8_ = local_d0;
      string::string((string *)local_160,pgVar2,(wstring_view *)local_1a0);
      json_parse_value(pvVar1,lex);
      (**(code **)(*plVar5 + 8))(plVar5,(gc_heap_ptr_untyped *)local_160,pvVar1,0);
      value::~value(pvVar1);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_160);
      std::__cxx11::wstring::~wstring((wstring *)local_d0);
      uVar6 = uVar6 + 1;
    }
    json_lexer::next_token((json_token *)(local_1a0 + 0x10),lex);
    std::__cxx11::wstring::~wstring((wstring *)(local_190 + 8));
    value::value(__return_storage_ptr__,(object_ptr *)local_100);
    this_00 = (gc_heap_ptr_untyped *)local_100;
    goto LAB_0014423d;
  default:
    json_lexer::throw_unexpected(lex,(json_token *)local_130);
  case 8:
    gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)lex);
    global_object::make_object((global_object *)local_1a0);
    pgVar2 = (lex->global_).super_gc_heap_ptr_untyped.heap_;
    iVar7 = 0;
    pvVar1 = (value *)(local_1a0 + 0x10);
    while( true ) {
      json_lexer::skip_whitespace(lex);
      jVar3 = this->type_;
      if (jVar3 == rbrace) break;
      bVar8 = iVar7 != 0;
      iVar7 = iVar7 + -1;
      if (bVar8) {
        if (jVar3 != comma) goto LAB_00144264;
        json_lexer::next_token((json_token *)local_90,lex);
        std::__cxx11::wstring::~wstring((wstring *)&local_88);
        json_lexer::skip_whitespace(lex);
        jVar3 = this->type_;
      }
      if (jVar3 != string) {
LAB_00144264:
        json_lexer::throw_unexpected(lex);
      }
      pwVar4 = (anonymous_namespace)::json_token::text_abi_cxx11_((json_token *)this);
      std::__cxx11::wstring::wstring((wstring *)local_160,(wstring *)pwVar4);
      json_lexer::next_token((json_token *)local_d0,lex);
      std::__cxx11::wstring::~wstring((wstring *)&local_c8);
      json_lexer::skip_whitespace(lex);
      if (this->type_ != colon) {
        json_lexer::throw_unexpected(lex);
      }
      json_lexer::next_token((json_token *)local_100,lex);
      std::__cxx11::wstring::~wstring((wstring *)(local_100 + 8));
      json_lexer::skip_whitespace(lex);
      plVar5 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_1a0);
      local_140._M_len = local_160._8_8_;
      local_140._M_str = (wchar_t *)local_160._0_8_;
      string::string((string *)&local_a0,pgVar2,&local_140);
      json_parse_value(pvVar1,lex);
      (**(code **)(*plVar5 + 8))(plVar5,&local_a0,pvVar1,0);
      value::~value(pvVar1);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_a0);
      std::__cxx11::wstring::~wstring((wstring *)local_160);
    }
    json_lexer::next_token((json_token *)(local_1a0 + 0x10),lex);
    std::__cxx11::wstring::~wstring((wstring *)(local_190 + 8));
    value::value(__return_storage_ptr__,(object_ptr *)local_1a0);
    this_00 = (gc_heap_ptr_untyped *)local_1a0;
LAB_0014423d:
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(this_00);
  }
  std::__cxx11::wstring::~wstring((wstring *)(local_130 + 8));
  return __return_storage_ptr__;
}

Assistant:

value json_parse_value(json_lexer& lex) {
    lex.skip_whitespace();
    auto token = lex.current_token();
    lex.next_token();
    switch (token.type()) {
    case json_token_type::string:       return value{string{lex.global().heap(), token.text()}};
    case json_token_type::number:       return value{to_number(token.text())};
    case json_token_type::null:         return value::null;
    case json_token_type::false_:       return value{false};
    case json_token_type::true_:        return value{true};
    case json_token_type::lbracket:     return json_parse_array(lex);
    case json_token_type::lbrace:       return json_parse_object(lex);
    default:
        break;
    }
    lex.throw_unexpected(token);
}